

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O3

void __thiscall
boost::detail::function::
basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
::
assign_functor<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (undefined8 param_1,undefined8 *f,undefined8 *functor)

{
  ulong __n;
  undefined8 *puVar1;
  undefined8 *__dest;
  undefined8 *__src;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  __n = f[2];
  puVar1[2] = __n;
  *puVar1 = 0;
  __src = f;
  __dest = puVar1;
  if (0x10 < __n) {
    __dest = (undefined8 *)operator_new__(__n);
    *puVar1 = __dest;
    __src = (undefined8 *)*f;
  }
  memcpy(__dest,__src,__n);
  *(undefined4 *)(puVar1 + 3) = *(undefined4 *)(f + 3);
  *functor = puVar1;
  return;
}

Assistant:

void
        assign_functor(FunctionObj f, function_buffer& functor, mpl::false_) const
        {
          functor.members.obj_ptr = new FunctionObj(f);
        }